

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timidity.cpp
# Opt level: O1

int Timidity::read_config_file(char *name,bool ismain)

{
  undefined4 *puVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  FileReader *pFVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ToneBank *pTVar8;
  undefined8 *puVar9;
  undefined4 extraout_var_00;
  long lVar10;
  char *pcVar11;
  int iVar12;
  int i;
  ulong uVar13;
  bool bVar14;
  int lumpnum;
  FCommandLine w;
  char tmp [1024];
  uint local_488;
  int local_484;
  long *local_478;
  int local_468;
  int local_464;
  FCommandLine local_460;
  char local_438 [1032];
  
  if (read_config_file::rcf_count < 0x33) {
    if (ismain) {
      pathExpander._16_4_ = 0;
    }
    pFVar6 = PathExpander::openFileReader((PathExpander *)pathExpander,name,&local_464);
    if (pFVar6 != (FileReader *)0x0) {
      if (ismain) {
        if (local_464 < 1) {
          pathExpander._16_4_ = 2;
        }
        else {
          pathExpander._16_4_ = 1;
          PathExpander::clearPathlist((PathExpander *)pathExpander);
        }
      }
      iVar3 = (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[5])(pFVar6,local_438,0x400);
      if (CONCAT44(extraout_var,iVar3) != 0) {
        local_488 = 0;
        local_478 = (long *)0x0;
        do {
          FCommandLine::FCommandLine(&local_460,local_438,true);
          iVar3 = FCommandLine::argc(&local_460);
          local_488 = local_488 + 1;
          bVar14 = false;
          if (iVar3 != 0) {
            pcVar7 = FCommandLine::operator[](&local_460,0);
            iVar4 = strcmp(pcVar7,"#extension");
            if (iVar4 == 0) {
              FCommandLine::Shift(&local_460);
              iVar3 = iVar3 + -1;
            }
            else {
              pcVar7 = FCommandLine::operator[](&local_460,0);
              if (*pcVar7 == '#') goto LAB_00354eeb;
            }
            iVar4 = iVar3;
            if (0 < iVar3) {
              iVar12 = 0;
              do {
                pcVar7 = FCommandLine::operator[](&local_460,iVar12);
                iVar4 = iVar12;
                if (*pcVar7 == '#') break;
                iVar12 = iVar12 + 1;
                iVar4 = iVar3;
              } while (iVar3 != iVar12);
            }
            pcVar7 = FCommandLine::operator[](&local_460,0);
            iVar3 = strcmp(pcVar7,"comm");
            bVar14 = false;
            if (iVar3 != 0) {
              pcVar7 = FCommandLine::operator[](&local_460,0);
              iVar3 = strcmp(pcVar7,"HTTPproxy");
              if (iVar3 != 0) {
                pcVar7 = FCommandLine::operator[](&local_460,0);
                iVar3 = strcmp(pcVar7,"FTPproxy");
                if (iVar3 != 0) {
                  pcVar7 = FCommandLine::operator[](&local_460,0);
                  iVar3 = strcmp(pcVar7,"mailaddr");
                  if (iVar3 != 0) {
                    pcVar7 = FCommandLine::operator[](&local_460,0);
                    iVar3 = strcmp(pcVar7,"opt");
                    if (iVar3 != 0) {
                      pcVar7 = FCommandLine::operator[](&local_460,0);
                      iVar3 = strcmp(pcVar7,"timeout");
                      if (iVar3 != 0) {
                        pcVar7 = FCommandLine::operator[](&local_460,0);
                        iVar3 = strcmp(pcVar7,"copydrumset");
                        if (iVar3 != 0) {
                          pcVar7 = FCommandLine::operator[](&local_460,0);
                          iVar3 = strcmp(pcVar7,"copybank");
                          if (iVar3 != 0) {
                            pcVar7 = FCommandLine::operator[](&local_460,0);
                            iVar3 = strcmp(pcVar7,"undef");
                            if (iVar3 != 0) {
                              pcVar7 = FCommandLine::operator[](&local_460,0);
                              iVar3 = strcmp(pcVar7,"altassign");
                              if (iVar3 != 0) {
                                pcVar7 = FCommandLine::operator[](&local_460,0);
                                iVar3 = strcmp(pcVar7,"soundfont");
                                if (iVar3 == 0) {
                                  if (iVar4 < 2) {
                                    Printf("%s: line %d: No soundfont given\n",name,(ulong)local_488
                                          );
                                    goto LAB_00354edc;
                                  }
                                  if (iVar4 != 2) {
                                    pcVar7 = FCommandLine::operator[](&local_460,2);
                                    iVar3 = strcmp(pcVar7,"remove");
                                    if (iVar3 == 0) {
                                      pcVar7 = FCommandLine::operator[](&local_460,1);
                                      font_remove(pcVar7);
                                      goto LAB_00354eeb;
                                    }
                                  }
                                  bVar14 = iVar4 != 2;
                                  if (bVar14) {
                                    iVar3 = 3;
                                    if (3 < iVar4) {
                                      iVar3 = iVar4;
                                    }
                                    iVar12 = 2;
                                    do {
                                      pcVar7 = FCommandLine::operator[](&local_460,iVar12);
                                      pcVar7 = strchr(pcVar7,0x3d);
                                      if (pcVar7 == (char *)0x0) {
                                        pcVar7 = FCommandLine::operator[](&local_460,iVar12);
                                        Printf("%s: line %d: bad soundfont option %s\n",name,
                                               (ulong)local_488,pcVar7);
                                        (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[1])
                                                  (pFVar6);
                                        goto LAB_00354eeb;
                                      }
                                      iVar12 = iVar12 + 1;
                                      bVar14 = iVar12 < iVar4;
                                    } while (iVar3 != iVar12);
                                  }
                                  pcVar7 = FCommandLine::operator[](&local_460,1);
                                  font_add(pcVar7,0);
                                }
                                else {
                                  pcVar7 = FCommandLine::operator[](&local_460,0);
                                  iVar3 = strcmp(pcVar7,"font");
                                  if (iVar3 == 0) {
                                    if (iVar4 < 3) {
                                      Printf("%s: line %d: syntax error\n",name,(ulong)local_488);
LAB_00354edc:
                                      (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[1])
                                                (pFVar6);
                                      bVar14 = true;
                                    }
                                    else {
                                      pcVar7 = FCommandLine::operator[](&local_460,1);
                                      iVar3 = strcmp(pcVar7,"exclude");
                                      if (iVar3 == 0) {
                                        local_468 = 0xfe;
                                        iVar3 = 2;
                                      }
                                      else {
                                        pcVar7 = FCommandLine::operator[](&local_460,1);
                                        iVar3 = strcmp(pcVar7,"order");
                                        if (iVar3 != 0) {
                                          Printf("%s: line %d: font subcommand must be \'order\' or \'exclude\'\n"
                                                 ,name,(ulong)local_488);
                                          goto LAB_00354edc;
                                        }
                                        pcVar7 = FCommandLine::operator[](&local_460,2);
                                        local_468 = atoi(pcVar7);
                                        iVar3 = 3;
                                      }
                                      iVar12 = -1;
                                      i = 3;
                                      local_484 = -1;
                                      if (iVar3 < iVar4) {
                                        pcVar7 = FCommandLine::operator[](&local_460,iVar3);
                                        i = iVar3 + 1;
                                        local_484 = atoi(pcVar7);
                                      }
                                      if (i < iVar4) {
                                        pcVar7 = FCommandLine::operator[](&local_460,i);
                                        i = i + 1;
                                        iVar12 = atoi(pcVar7);
                                      }
                                      iVar3 = -1;
                                      if (i < iVar4) {
                                        pcVar7 = FCommandLine::operator[](&local_460,i);
                                        iVar3 = atoi(pcVar7);
                                      }
                                      if (local_484 != 0x80) {
                                        iVar3 = iVar12;
                                        iVar12 = local_484;
                                      }
                                      font_order(local_468,(uint)(local_484 == 0x80),iVar12,iVar3);
                                    }
                                  }
                                  else {
                                    pcVar7 = FCommandLine::operator[](&local_460,0);
                                    iVar3 = strcmp(pcVar7,"progbase");
                                    if (iVar3 != 0) {
                                      pcVar7 = FCommandLine::operator[](&local_460,0);
                                      iVar3 = strcmp(pcVar7,"map");
                                      if (iVar3 != 0) {
                                        pcVar7 = FCommandLine::operator[](&local_460,0);
                                        iVar3 = strcmp(pcVar7,"dir");
                                        if (iVar3 == 0) {
                                          if (iVar4 < 2) {
                                            Printf("%s: line %d: No directory given\n",name,
                                                   (ulong)local_488);
                                            goto LAB_00354edc;
                                          }
                                          iVar3 = 1;
                                          do {
                                            pcVar7 = FCommandLine::operator[](&local_460,iVar3);
                                            PathExpander::addToPathlist
                                                      ((PathExpander *)pathExpander,pcVar7);
                                            iVar3 = iVar3 + 1;
                                          } while (iVar4 != iVar3);
                                        }
                                        else {
                                          pcVar7 = FCommandLine::operator[](&local_460,0);
                                          iVar3 = strcmp(pcVar7,"source");
                                          if (iVar3 != 0) {
                                            pcVar7 = FCommandLine::operator[](&local_460,0);
                                            iVar3 = strcmp(pcVar7,"default");
                                            if (iVar3 == 0) {
                                              if (iVar4 == 2) {
                                                pcVar7 = FCommandLine::operator[](&local_460,1);
                                                FString::operator=((FString *)&def_instr_name,pcVar7
                                                                  );
                                                goto LAB_00354eeb;
                                              }
                                              Printf(
                                                  "%s: line %d: Must specify exactly one patch name\n"
                                                  ,name,(ulong)local_488);
                                            }
                                            else {
                                              pcVar7 = FCommandLine::operator[](&local_460,0);
                                              iVar3 = strcmp(pcVar7,"drumset");
                                              if (iVar3 == 0) {
                                                if (iVar4 < 2) {
                                                  Printf("%s: line %d: No drum set number given\n",
                                                         name,(ulong)local_488);
                                                }
                                                else {
                                                  pcVar7 = FCommandLine::operator[](&local_460,1);
                                                  uVar5 = atoi(pcVar7);
                                                  if (uVar5 < 0x80) {
                                                    uVar13 = (ulong)uVar5;
                                                    if ((&drumset)[uVar13] == 0) {
                                                      pTVar8 = (ToneBank *)operator_new(0x408);
                                                      ToneBank::ToneBank(pTVar8);
                                                      (&drumset)[uVar13] = pTVar8;
                                                    }
                                                    puVar9 = &drumset;
LAB_00354ea2:
                                                    local_478 = (long *)puVar9[uVar13];
                                                    goto LAB_00354eeb;
                                                  }
                                                  Printf(
                                                  "%s: line %d: Drum set must be between 0 and 127\n"
                                                  ,name,(ulong)local_488);
                                                }
                                              }
                                              else {
                                                pcVar7 = FCommandLine::operator[](&local_460,0);
                                                iVar3 = strcmp(pcVar7,"bank");
                                                if (iVar3 == 0) {
                                                  if (iVar4 < 2) {
                                                    Printf("%s: line %d: No bank number given\n",
                                                           name,(ulong)local_488);
                                                  }
                                                  else {
                                                    pcVar7 = FCommandLine::operator[](&local_460,1);
                                                    uVar5 = atoi(pcVar7);
                                                    if (uVar5 < 0x80) {
                                                      uVar13 = (ulong)uVar5;
                                                      if ((&tonebank)[uVar13] == 0) {
                                                        pTVar8 = (ToneBank *)operator_new(0x408);
                                                        ToneBank::ToneBank(pTVar8);
                                                        (&tonebank)[uVar13] = pTVar8;
                                                      }
                                                      puVar9 = &tonebank;
                                                      goto LAB_00354ea2;
                                                    }
                                                    Printf(
                                                  "%s: line %d: Tone bank must be between 0 and 127\n"
                                                  ,name,(ulong)local_488);
                                                  }
                                                }
                                                else if (((iVar4 < 2) ||
                                                         (pcVar7 = FCommandLine::operator[]
                                                                             (&local_460,0),
                                                         *pcVar7 < '0')) ||
                                                        (pcVar7 = FCommandLine::operator[]
                                                                            (&local_460,0),
                                                        '9' < *pcVar7)) {
                                                  Printf("%s: line %d: syntax error\n",name,
                                                         (ulong)local_488);
                                                }
                                                else {
                                                  pcVar7 = FCommandLine::operator[](&local_460,0);
                                                  uVar5 = atoi(pcVar7);
                                                  if (uVar5 < 0x80) {
                                                    if (local_478 == (long *)0x0) {
                                                      Printf(
                                                  "%s: line %d: Must specify tone bank or drum set before assignment\n"
                                                  ,name,(ulong)local_488);
                                                  (*(pFVar6->super_FileReaderBase).
                                                    _vptr_FileReaderBase[1])(pFVar6);
                                                  bVar14 = true;
                                                  local_478 = (long *)0x0;
                                                  }
                                                  else {
                                                    lVar2 = *local_478;
                                                    lVar10 = (ulong)uVar5 * 0x20;
                                                    puVar1 = (undefined4 *)(lVar2 + 8 + lVar10);
                                                    *puVar1 = 0xffffffff;
                                                    puVar1[1] = 0xffffffff;
                                                    puVar1[2] = 0xffffffff;
                                                    puVar1[3] = 0xffffffff;
                                                    *(undefined8 *)(lVar2 + 0x17 + lVar10) =
                                                         0xffffffffffffffff;
                                                    pcVar7 = FCommandLine::operator[](&local_460,1);
                                                    iVar3 = strcmp(pcVar7,"%font");
                                                    if (iVar3 == 0) {
                                                      pcVar7 = FCommandLine::operator[]
                                                                         (&local_460,2);
                                                      FString::operator=((FString *)
                                                                         (*local_478 + lVar10),
                                                                         pcVar7);
                                                      pcVar7 = FCommandLine::operator[]
                                                                         (&local_460,3);
                                                      iVar3 = atoi(pcVar7);
                                                      *(int *)(*local_478 + 0x10 + lVar10) = iVar3;
                                                      pcVar7 = FCommandLine::operator[]
                                                                         (&local_460,4);
                                                      iVar3 = atoi(pcVar7);
                                                      lVar2 = *local_478;
                                                      *(int *)(lVar2 + 0x14 + lVar10) = iVar3;
                                                      local_484 = 5;
                                                      if ((5 < iVar4) &&
                                                         ((*(int *)(lVar2 + 0x10 + lVar10) == 0x80
                                                          || ((pcVar7 = FCommandLine::operator[]
                                                                                  (&local_460,5),
                                                              '/' < *pcVar7 &&
                                                              (pcVar7 = FCommandLine::operator[]
                                                                                  (&local_460,5),
                                                              *pcVar7 < ':')))))) {
                                                        pcVar7 = FCommandLine::operator[]
                                                                           (&local_460,5);
                                                        iVar3 = atoi(pcVar7);
                                                        *(int *)(*local_478 + 0x18 + lVar10) = iVar3
                                                        ;
                                                        local_484 = 6;
                                                      }
                                                      pcVar7 = FCommandLine::operator[]
                                                                         (&local_460,2);
                                                      font_add(pcVar7,0xfe);
                                                    }
                                                    else {
                                                      pcVar7 = FCommandLine::operator[]
                                                                         (&local_460,1);
                                                      local_484 = 2;
                                                      FString::operator=((FString *)
                                                                         (*local_478 + lVar10),
                                                                         pcVar7);
                                                    }
                                                    if (local_484 < iVar4) {
                                                      do {
                                                        pcVar7 = FCommandLine::operator[]
                                                                           (&local_460,local_484);
                                                        pcVar7 = strchr(pcVar7,0x3d);
                                                        if (pcVar7 == (char *)0x0) {
                                                          pcVar7 = FCommandLine::operator[]
                                                                             (&local_460,local_484);
                                                          Printf(
                                                  "%s: line %d: bad patch option %s\n",name,
                                                  (ulong)local_488,pcVar7);
                                                  goto LAB_00354edc;
                                                  }
                                                  *pcVar7 = '\0';
                                                  pcVar11 = FCommandLine::operator[]
                                                                      (&local_460,local_484);
                                                  iVar3 = strcmp(pcVar11,"amp");
                                                  if (iVar3 != 0) {
                                                    pcVar11 = FCommandLine::operator[]
                                                                        (&local_460,local_484);
                                                    pcVar7 = pcVar7 + 1;
                                                    iVar3 = strcmp(pcVar11,"note");
                                                    if (iVar3 == 0) {
                                                      uVar5 = atoi(pcVar7);
                                                      if ((0x7f < uVar5) ||
                                                         ((byte)(*pcVar7 - 0x3aU) < 0xf6)) {
                                                        Printf(
                                                  "%s: line %d: note must be between 0 and 127\n",
                                                  name,(ulong)local_488);
                                                  goto LAB_00354edc;
                                                  }
                                                  *(uint *)(*local_478 + 8 + lVar10) = uVar5;
                                                  }
                                                  else {
                                                    pcVar11 = FCommandLine::operator[]
                                                                        (&local_460,local_484);
                                                    iVar3 = strcmp(pcVar11,"pan");
                                                    if (iVar3 == 0) {
                                                      iVar3 = strcmp(pcVar7,"center");
                                                      if (iVar3 == 0) {
                                                        uVar5 = 0x40;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar7,"left");
                                                        if (iVar3 == 0) {
                                                          uVar5 = 0;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar7,"right");
                                                          if (iVar3 == 0) {
                                                            uVar5 = 0x7f;
                                                          }
                                                          else {
                                                            iVar3 = atoi(pcVar7);
                                                            uVar5 = (iVar3 * 100 + 10000) / 0x9d;
                                                          }
                                                        }
                                                      }
                                                      if ((0x7f < uVar5) ||
                                                         ((uVar5 == 0 &&
                                                          ((byte)(*pcVar7 - 0x3aU) < 0xf6 &&
                                                           *pcVar7 != '-')))) {
                                                        Printf(
                                                  "%s: line %d: panning must be left, right, center, or between -100 and 100\n"
                                                  ,name,(ulong)local_488);
                                                  goto LAB_00354edc;
                                                  }
                                                  *(uint *)(*local_478 + 0xc + lVar10) = uVar5;
                                                  }
                                                  else {
                                                    pcVar11 = FCommandLine::operator[]
                                                                        (&local_460,local_484);
                                                    iVar3 = strcmp(pcVar11,"keep");
                                                    if (iVar3 == 0) {
                                                      iVar3 = strcmp(pcVar7,"env");
                                                      if (iVar3 == 0) {
                                                        *(undefined1 *)(*local_478 + 0x1d + lVar10)
                                                             = 0;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar7,"loop");
                                                        if (iVar3 != 0) {
                                                          Printf(
                                                  "%s: line %d: keep must be env or loop\n",name,
                                                  (ulong)local_488);
                                                  goto LAB_00354edc;
                                                  }
                                                  *(undefined1 *)(*local_478 + 0x1c + lVar10) = 0;
                                                  }
                                                  }
                                                  else {
                                                    pcVar11 = FCommandLine::operator[]
                                                                        (&local_460,local_484);
                                                    iVar3 = strcmp(pcVar11,"strip");
                                                    if (iVar3 != 0) {
                                                      pcVar7 = FCommandLine::operator[]
                                                                         (&local_460,local_484);
                                                      Printf("%s: line %d: bad patch option %s\n",
                                                             name,(ulong)local_488,pcVar7);
                                                      goto LAB_00354edc;
                                                    }
                                                    iVar3 = strcmp(pcVar7,"env");
                                                    if (iVar3 == 0) {
                                                      *(undefined1 *)(*local_478 + 0x1d + lVar10) =
                                                           1;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar7,"loop");
                                                      if (iVar3 == 0) {
                                                        *(undefined1 *)(*local_478 + 0x1c + lVar10)
                                                             = 1;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar7,"tail");
                                                        if (iVar3 != 0) {
                                                          Printf(
                                                  "%s: line %d: strip must be env, loop, or tail\n",
                                                  name,(ulong)local_488);
                                                  goto LAB_00354edc;
                                                  }
                                                  *(undefined1 *)(*local_478 + 0x1e + lVar10) = 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  local_484 = local_484 + 1;
                                                  } while (iVar4 != local_484);
                                                  }
                                                  }
                                                  goto LAB_00354eeb;
                                                  }
                                                  Printf(
                                                  "%s: line %d: Program must be between 0 and 127\n"
                                                  ,name,(ulong)local_488);
                                                }
                                              }
                                            }
                                            goto LAB_00354edc;
                                          }
                                          if (iVar4 < 2) {
                                            bVar14 = true;
                                            Printf("%s: line %d: No file name given\n",name,
                                                   (ulong)local_488);
                                          }
                                          else {
                                            iVar3 = 1;
                                            do {
                                              read_config_file::rcf_count =
                                                   read_config_file::rcf_count + 1;
                                              pcVar7 = FCommandLine::operator[](&local_460,iVar3);
                                              read_config_file(pcVar7,false);
                                              read_config_file::rcf_count =
                                                   read_config_file::rcf_count + -1;
                                              iVar3 = iVar3 + 1;
                                            } while (iVar4 != iVar3);
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
LAB_00354eeb:
          FCommandLine::~FCommandLine(&local_460);
          if (bVar14) {
            return -2;
          }
          iVar3 = (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[5])(pFVar6,local_438,0x400);
        } while (CONCAT44(extraout_var_00,iVar3) != 0);
      }
      (*(pFVar6->super_FileReaderBase)._vptr_FileReaderBase[1])(pFVar6);
      return 0;
    }
  }
  else {
    Printf("Timidity: Probable source loop in configuration files\n");
  }
  return -1;
}

Assistant:

static int read_config_file(const char *name, bool ismain)
{
	FileReader *fp;
	char tmp[1024], *cp;
	ToneBank *bank = NULL;
	int i, j, k, line = 0, words;
	static int rcf_count = 0;
	int lumpnum;

	if (rcf_count > 50)
	{
		Printf("Timidity: Probable source loop in configuration files\n");
		return (-1);
	}

	if (ismain) pathExpander.openmode = PathExpander::OM_FILEORLUMP;

	if (!(fp = pathExpander.openFileReader(name, &lumpnum)))
		return -1;

	if (ismain)
	{
		if (lumpnum > 0)
		{
			pathExpander.openmode = PathExpander::OM_LUMP;
			pathExpander.clearPathlist();	// when reading from a PK3 we don't want to use any external path
		}
		else
		{
			pathExpander.openmode = PathExpander::OM_FILE;
		}
	}

	while (fp->Gets(tmp, sizeof(tmp)))
	{
		line++;
		FCommandLine w(tmp, true);
		words = w.argc();
		if (words == 0) continue;

		/* Originally the TiMidity++ extensions were prefixed like this */
		if (strcmp(w[0], "#extension") == 0)
		{
			w.Shift();
			words--;
		}
		else if (*w[0] == '#')
		{
			continue;
		}

		for (i = 0; i < words; ++i)
		{
			if (*w[i] == '#')
			{
				words = i;
				break;
			}
		}

		/*
		 * TiMidity++ adds a number of extensions to the config file format.
		 * Many of them are completely irrelevant to SDL_sound, but at least
		 * we shouldn't choke on them.
		 *
		 * Unfortunately the documentation for these extensions is often quite
		 * vague, gramatically strange or completely absent.
		 */
		if (
			!strcmp(w[0], "comm")			/* "comm" program second        */
			|| !strcmp(w[0], "HTTPproxy")	/* "HTTPproxy" hostname:port    */
			|| !strcmp(w[0], "FTPproxy")	/* "FTPproxy" hostname:port     */
			|| !strcmp(w[0], "mailaddr")	/* "mailaddr" your-mail-address */
			|| !strcmp(w[0], "opt")			/* "opt" timidity-options       */
			)
		{
			/*
			* + "comm" sets some kind of comment -- the documentation is too
			*   vague for me to understand at this time.
			* + "HTTPproxy", "FTPproxy" and "mailaddr" are for reading data
			*   over a network, rather than from the file system.
			* + "opt" specifies default options for TiMidity++.
			*
			* These are all quite useless for our version of TiMidity, so
			* they can safely remain no-ops.
			*/
		}
		else if (!strcmp(w[0], "timeout"))	/* "timeout" program second */
		{
			/*
			* Specifies a timeout value of the program. A number of seconds
			* before TiMidity kills the note. This may be useful to implement
			* later, but I don't see any urgent need for it.
			*/
			//Printf("FIXME: Implement \"timeout\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "copydrumset")	/* "copydrumset" drumset */
			|| !strcmp(w[0], "copybank"))		/* "copybank" bank       */
		{
			/*
			* Copies all the settings of the specified drumset or bank to
			* the current drumset or bank. May be useful later, but not a
			* high priority.
			*/
			//Printf("FIXME: Implement \"%s\" in TiMidity config.\n", w[0]);
		}
		else if (!strcmp(w[0], "undef"))		/* "undef" progno */
		{
			/*
			* Undefines the tone "progno" of the current tone bank (or
			* drum set?). Not a high priority.
			*/
			//Printf("FIXME: Implement \"undef\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "altassign")) /* "altassign" prog1 prog2 ... */
		{
			/*
			* Sets the alternate assign for drum set. Whatever that's
			* supposed to mean.
			*/
			//Printf("FIXME: Implement \"altassign\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "soundfont"))
		{
			/*
			* "soundfont" sf_file "remove"
			* "soundfont" sf_file ["order=" order] ["cutoff=" cutoff]
			*                     ["reso=" reso] ["amp=" amp]
			*/
			if (words < 2)
			{
				Printf("%s: line %d: No soundfont given\n", name, line);
				delete fp;
				return -2;
			}
			if (words > 2 && !strcmp(w[2], "remove"))
			{
				font_remove(w[1]);
			}
			else
			{
				int order = 0;

				for (i = 2; i < words; ++i)
				{
					if (!(cp = strchr(w[i], '=')))
					{
						Printf("%s: line %d: bad soundfont option %s\n", name, line, w[i]);
						delete fp;
						return -2;
					}
				}
				font_add(w[1], order);
			}
		}
		else if (!strcmp(w[0], "font"))
		{
			/*
			* "font" "exclude" bank preset keynote
			* "font" "order" order bank preset keynote
			*/
			int order, drum = -1, bank = -1, instr = -1;

			if (words < 3)
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}

			if (!strcmp(w[1], "exclude"))
			{
				order = 254;
				i = 2;
			}
			else if (!strcmp(w[1], "order"))
			{
				order = atoi(w[2]);
				i = 3;
			}
			else
			{
				Printf("%s: line %d: font subcommand must be 'order' or 'exclude'\n", name, line);
				delete fp;
				return -2;
			}
			if (i < words)
			{
				drum = atoi(w[i++]);
			}
			if (i < words)
			{
				bank = atoi(w[i++]);
			}
			if (i < words)
			{
				instr = atoi(w[i++]);
			}
			if (drum != 128)
			{
				instr = bank;
				bank = drum;
				drum = 0;
			}
			else
			{
				drum = 1;
			}
			font_order(order, drum, bank, instr);
		}
		else if (!strcmp(w[0], "progbase"))
		{
			/*
			* The documentation for this makes absolutely no sense to me, but
			* apparently it sets some sort of base offset for tone numbers.
			* Why anyone would want to do this is beyond me.
			*/
			//Printf("FIXME: Implement \"progbase\" in TiMidity config.\n");
		}
		else if (!strcmp(w[0], "map")) /* "map" name set1 elem1 set2 elem2 */
		{
			/*
			* This extension is the one we will need to implement, as it is
			* used by the "eawpats". Unfortunately I cannot find any
			* documentation whatsoever for it, but it looks like it's used
			* for remapping one instrument to another somehow.
			*/
			//Printf("FIXME: Implement \"map\" in TiMidity config.\n");
		}

		/* Standard TiMidity config */

		else if (!strcmp(w[0], "dir"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No directory given\n", name, line);
				delete fp;
				return -2;
			}
			for (i = 1; i < words; i++)
				pathExpander.addToPathlist(w[i]);
		}
		else if (!strcmp(w[0], "source"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No file name given\n", name, line);
				return -2;
			}
			for (i=1; i<words; i++)
			{
				rcf_count++;
				read_config_file(w[i], false);
				rcf_count--;
			}
		}
		else if (!strcmp(w[0], "default"))
		{
			if (words != 2)
			{
				Printf("%s: line %d: Must specify exactly one patch name\n", name, line);
				delete fp;
				return -2;
			}
			def_instr_name = w[1];
		}
		else if (!strcmp(w[0], "drumset"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No drum set number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Drum set must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (drumset[i] == NULL)
			{
				drumset[i] = new ToneBank;
			}
			bank = drumset[i];
		}
		else if (!strcmp(w[0], "bank"))
		{
			if (words < 2)
			{
				Printf("%s: line %d: No bank number given\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[1]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Tone bank must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (tonebank[i] == NULL)
			{
				tonebank[i] = new ToneBank;
			}
			bank = tonebank[i];
		}
		else
		{
			if ((words < 2) || (*w[0] < '0' || *w[0] > '9'))
			{
				Printf("%s: line %d: syntax error\n", name, line);
				delete fp;
				return -2;
			}
			i = atoi(w[0]);
			if (i < 0 || i > 127)
			{
				Printf("%s: line %d: Program must be between 0 and 127\n", name, line);
				delete fp;
				return -2;
			}
			if (bank == NULL)
			{
				Printf("%s: line %d: Must specify tone bank or drum set before assignment\n", name, line);
				delete fp;
				return -2;
			}
			bank->tone[i].note = bank->tone[i].pan =
				bank->tone[i].fontbank = bank->tone[i].fontpreset =
				bank->tone[i].fontnote = bank->tone[i].strip_loop = 
				bank->tone[i].strip_envelope = bank->tone[i].strip_tail = -1;

			if (!strcmp(w[1], "%font"))
			{
				bank->tone[i].name = w[2];
				bank->tone[i].fontbank = atoi(w[3]);
				bank->tone[i].fontpreset = atoi(w[4]);
				if (words > 5 && (bank->tone[i].fontbank == 128 || (w[5][0] >= '0' && w[5][0] <= '9')))
				{
					bank->tone[i].fontnote = atoi(w[5]);
					j = 6;
				}
				else
				{
					j = 5;
				}
				font_add(w[2], 254);
			}
			else
			{
				bank->tone[i].name = w[1];
				j = 2;
			}

			for (; j<words; j++)
			{
				if (!(cp=strchr(w[j], '=')))
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
				*cp++ = 0;
				if (!strcmp(w[j], "amp"))
				{
					/* Ignored */
				}
				else if (!strcmp(w[j], "note"))
				{
					k = atoi(cp);
					if ((k < 0 || k > 127) || (*cp < '0' || *cp > '9'))
					{
						Printf("%s: line %d: note must be between 0 and 127\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].note = k;
				}
				else if (!strcmp(w[j], "pan"))
				{
					if (!strcmp(cp, "center"))
						k = 64;
					else if (!strcmp(cp, "left"))
						k = 0;
					else if (!strcmp(cp, "right"))
						k = 127;
					else
						k = ((atoi(cp)+100) * 100) / 157;
					if ((k < 0 || k > 127) ||
						(k == 0 && *cp != '-' && (*cp < '0' || *cp > '9')))
					{
						Printf("%s: line %d: panning must be left, right, "
							"center, or between -100 and 100\n", name, line);
						delete fp;
						return -2;
					}
					bank->tone[i].pan = k;
				}
				else if (!strcmp(w[j], "keep"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 0;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 0;
					else
					{
						Printf("%s: line %d: keep must be env or loop\n", name, line);
						delete fp;
						return -2;
					}
				}
				else if (!strcmp(w[j], "strip"))
				{
					if (!strcmp(cp, "env"))
						bank->tone[i].strip_envelope = 1;
					else if (!strcmp(cp, "loop"))
						bank->tone[i].strip_loop = 1;
					else if (!strcmp(cp, "tail"))
						bank->tone[i].strip_tail = 1;
					else
					{
						Printf("%s: line %d: strip must be env, loop, or tail\n", name, line);
						delete fp;
						return -2;
					}
				}
				else
				{
					Printf("%s: line %d: bad patch option %s\n", name, line, w[j]);
					delete fp;
					return -2;
				}
			}
		}
	}
	/*
	if (ferror(fp))
	{
		Printf("Can't read %s: %s\n", name, strerror(errno));
		close_file(fp);
		return -2;
	}
	*/
	delete fp;
	return 0;
}